

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void dictionary_del(dictionary *d)

{
  long local_18;
  ssize_t i;
  dictionary *d_local;
  
  if (d != (dictionary *)0x0) {
    for (local_18 = 0; local_18 < d->size; local_18 = local_18 + 1) {
      if (d->key[local_18] != (char *)0x0) {
        free(d->key[local_18]);
      }
      if (d->val[local_18] != (char *)0x0) {
        free(d->val[local_18]);
      }
    }
    free(d->val);
    free(d->key);
    free(d->hash);
    free(d);
  }
  return;
}

Assistant:

void dictionary_del(dictionary * d)
{
    ssize_t  i ;

    if (d == NULL) return ;
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] != NULL)
            free(d->key[i]);
        if (d->val[i] != NULL)
            free(d->val[i]);
    }
    free(d->val);
    free(d->key);
    free(d->hash);
    free(d);
    return ;
}